

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::MessageBuilderGenerator
          (MessageBuilderGenerator *this,Descriptor *descriptor,Context *context)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  ClassNameResolver *pCVar3;
  LogMessage *pLVar4;
  int i;
  long lVar5;
  long lVar6;
  LogFinisher local_69;
  LogMessage local_68;
  
  this->_vptr_MessageBuilderGenerator = (_func_int **)&PTR__MessageBuilderGenerator_004d99a8;
  this->descriptor_ = descriptor;
  this->context_ = context;
  pCVar3 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar3;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::FieldGeneratorMap
            (&this->field_generators_,descriptor,this->context_);
  p_Var1 = &(this->oneofs_)._M_t._M_impl.super__Rb_tree_header;
  (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((context->options_).enforce_lite == true) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_message_builder.cc"
               ,0x4c);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: HasDescriptorMethods(descriptor->file(), context->EnforceLite()): "
                       );
    pLVar4 = internal::LogMessage::operator<<
                       (pLVar4,
                        "Generator factory error: A non-lite message generator is used to generate lite messages."
                       );
    internal::LogFinisher::operator=(&local_69,pLVar4);
    internal::LogMessage::~LogMessage(&local_68);
  }
  lVar6 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(this->descriptor_ + 4); lVar5 = lVar5 + 1) {
    bVar2 = IsRealOneof((FieldDescriptor *)(*(long *)(this->descriptor_ + 0x28) + lVar6));
    if (bVar2) {
      if ((*(byte *)(*(long *)(this->descriptor_ + 0x28) + 1 + lVar6) & 0x10) == 0) {
        local_68.level_ = LOGLEVEL_INFO;
        local_68._4_4_ = 0;
      }
      else {
        local_68._0_8_ = *(undefined8 *)(*(long *)(this->descriptor_ + 0x28) + 0x28 + lVar6);
      }
      std::
      _Rb_tree<google::protobuf::OneofDescriptor_const*,google::protobuf::OneofDescriptor_const*,std::_Identity<google::protobuf::OneofDescriptor_const*>,std::less<google::protobuf::OneofDescriptor_const*>,std::allocator<google::protobuf::OneofDescriptor_const*>>
      ::_M_insert_unique<google::protobuf::OneofDescriptor_const*>
                ((_Rb_tree<google::protobuf::OneofDescriptor_const*,google::protobuf::OneofDescriptor_const*,std::_Identity<google::protobuf::OneofDescriptor_const*>,std::less<google::protobuf::OneofDescriptor_const*>,std::allocator<google::protobuf::OneofDescriptor_const*>>
                  *)&this->oneofs_,(OneofDescriptor **)&local_68);
    }
    lVar6 = lVar6 + 0x48;
  }
  return;
}

Assistant:

MessageBuilderGenerator::MessageBuilderGenerator(const Descriptor* descriptor,
                                                 Context* context)
    : descriptor_(descriptor),
      context_(context),
      name_resolver_(context->GetNameResolver()),
      field_generators_(descriptor, context_) {
  GOOGLE_CHECK(HasDescriptorMethods(descriptor->file(), context->EnforceLite()))
      << "Generator factory error: A non-lite message generator is used to "
         "generate lite messages.";
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (IsRealOneof(descriptor_->field(i))) {
      oneofs_.insert(descriptor_->field(i)->containing_oneof());
    }
  }
}